

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.cpp
# Opt level: O0

void __thiscall booster::fork_shared_mutex::shared_lock(fork_shared_mutex *this)

{
  int iVar1;
  pthread_rwlock_t *ppVar2;
  data *pdVar3;
  int *piVar4;
  char *pcVar5;
  hold_ptr<booster::fork_shared_mutex::data> *in_RDI;
  int err;
  int res;
  flock lock;
  char *pcVar6;
  uint in_stack_ffffffffffffffb4;
  int iVar7;
  system_error *in_stack_ffffffffffffffc0;
  undefined2 local_28;
  undefined2 local_26;
  
  ppVar2 = (pthread_rwlock_t *)hold_ptr<booster::fork_shared_mutex::data>::operator->(in_RDI);
  pthread_rwlock_rdlock(ppVar2);
  memset(&local_28,0,0x20);
  local_28 = 0;
  local_26 = 0;
  do {
    pdVar3 = hold_ptr<booster::fork_shared_mutex::data>::operator->(in_RDI);
    iVar1 = fileno((FILE *)pdVar3->lock_file);
    iVar1 = fcntl(iVar1,7,&local_28);
    in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 & 0xffffff;
    if (iVar1 != 0) {
      piVar4 = __errno_location();
      in_stack_ffffffffffffffb4 = CONCAT13(*piVar4 == 4,(int3)in_stack_ffffffffffffffb4);
    }
  } while ((char)(in_stack_ffffffffffffffb4 >> 0x18) != '\0');
  if (iVar1 != 0) {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    ppVar2 = (pthread_rwlock_t *)hold_ptr<booster::fork_shared_mutex::data>::operator->(in_RDI);
    iVar7 = (int)((ulong)in_RDI >> 0x20);
    pthread_rwlock_unlock(ppVar2);
    pcVar5 = (char *)__cxa_allocate_exception(0x40);
    pcVar6 = pcVar5;
    std::_V2::system_category();
    system::system_error::system_error
              (in_stack_ffffffffffffffc0,iVar7,
               (error_category *)CONCAT44(in_stack_ffffffffffffffb4,iVar1),pcVar6);
    __cxa_throw(pcVar5,&system::system_error::typeinfo,system::system_error::~system_error);
  }
  return;
}

Assistant:

void fork_shared_mutex::shared_lock()
	{
		pthread_rwlock_rdlock(&d->lock);
		struct flock lock;
		memset(&lock,0,sizeof(lock));
		lock.l_type=F_RDLCK;
		lock.l_whence=SEEK_SET;
		int res = 0;
		while((res = ::fcntl(fileno(d->lock_file),F_SETLKW,&lock))!=0 && errno==EINTR)
			;
		if(res == 0)
			return;
		int err = errno;
		pthread_rwlock_unlock(&d->lock);
		throw system::system_error(err,system::system_category(),"fork_shared_mutex: failed to lock");
	}